

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_close(csh *handle)

{
  void *__s;
  cs_struct *ud;
  csh *handle_local;
  
  if (*handle == 0) {
    handle_local._4_4_ = CS_ERR_CSH;
  }
  else {
    __s = (void *)*handle;
    if (*(long *)((long)__s + 0x10) != 0) {
      (*cs_mem_free)(*(void **)((long)__s + 0x10));
    }
    (*cs_mem_free)(*(void **)((long)__s + 0xf0));
    memset(__s,0,0x128);
    (*cs_mem_free)(__s);
    *handle = 0;
    handle_local._4_4_ = CS_ERR_OK;
  }
  return handle_local._4_4_;
}

Assistant:

CAPSTONE_EXPORT
cs_err cs_close(csh *handle)
{
	struct cs_struct *ud;

	if (*handle == 0)
		// invalid handle
		return CS_ERR_CSH;

	ud = (struct cs_struct *)(*handle);

	if (ud->printer_info)
		cs_mem_free(ud->printer_info);

	cs_mem_free(ud->insn_cache);

	memset(ud, 0, sizeof(*ud));
	cs_mem_free(ud);

	// invalidate this handle by ZERO out its value.
	// this is to make sure it is unusable after cs_close()
	*handle = 0;

	return CS_ERR_OK;
}